

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O2

void __thiscall
HashtableAllTest_BracketInsert_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_BracketInsert_Test
          (HashtableAllTest_BracketInsert_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::~HashtableTest((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                    *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BracketInsert) {
  // tests operator[], for those types that support it.
  if (!this->ht_.supports_brackets()) return;

  // bracket_equal is equivalent to ht_[a] == b.  It should insert a if
  // it doesn't already exist.
  EXPECT_TRUE(
      this->ht_.bracket_equal(this->UniqueKey(1), this->ht_.default_data()));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(1)) != this->ht_.end());

  // bracket_assign is equivalent to ht_[a] = b.
  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(4)));
  EXPECT_TRUE(this->ht_.find(this->UniqueKey(2)) != this->ht_.end());
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(4))));

  this->ht_.bracket_assign(this->UniqueKey(2),
                           this->ht_.get_data(this->UniqueObject(6)));
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));
  // bracket_equal shouldn't have modified the value.
  EXPECT_TRUE(this->ht_.bracket_equal(
      this->UniqueKey(2), this->ht_.get_data(this->UniqueObject(6))));

  // Verify that an operator[] that doesn't cause a resize, also
  // doesn't require an extra rehash.
  TypeParam ht(100);
  EXPECT_EQ(0, ht.hash_funct().num_hashes());
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(1, ht.hash_funct().num_hashes());

  // And overwriting, likewise, should only cause one extra hash.
  ht.bracket_assign(this->UniqueKey(2), ht.get_data(this->UniqueObject(2)));
  EXPECT_EQ(2, ht.hash_funct().num_hashes());
}